

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O1

void __thiscall
TileWire::_addNextTile
          (TileWire *this,Tile *nextTile,Direction direction,State *state,FollowWireStage *stage)

{
  pointer *pppTVar1;
  _func_int **pp_Var2;
  char *__s1;
  TileWire *pTVar3;
  bool bVar4;
  pointer ppVar5;
  _Elt_pointer ppVar6;
  int iVar7;
  State SVar8;
  Direction DVar9;
  pair<TileWire_*,_Direction> *wire;
  vector<TileLED_*,_std::allocator<TileLED_*>_> *pvVar10;
  pointer ppVar11;
  Board *pBVar12;
  uint uVar13;
  uint uVar14;
  TileGate *nextGate;
  TileWire *nextWire;
  pair<TileWire_*,_Direction> local_48;
  TileWire *local_38;
  
  if (nextTile == (Tile *)0x0) {
    __cxa_bad_typeid();
  }
  pp_Var2 = nextTile->_vptr_Tile;
  __s1 = *(char **)(pp_Var2[-1] + 8);
  if ((__s1 == "8TileWire") || ((*__s1 != '*' && (iVar7 = strcmp(__s1,"8TileWire"), iVar7 == 0)))) {
    uVar13 = Tile::currentUpdateTime;
    uVar14 = direction + 5;
    if (-1 < (int)(direction + SOUTH)) {
      uVar14 = direction + SOUTH;
    }
    if ((&(&this->super_Tile)[(long)(int)nextTile->_direction * 2].field_0x21)
        [(long)(int)((direction - (uVar14 & 0xfffffffc)) + 2) +
         (long)(int)direction * 4 + (long)*(int *)&nextTile[8].field_0x24 * 0x10] != '\x01') {
      return;
    }
    if ((direction & 0x80000001) == EAST && *(int *)&nextTile[8].field_0x24 == 4) {
      if (*(uint *)&nextTile[9].field_0xc == Tile::currentUpdateTime) {
        return;
      }
      *(State *)((long)&nextTile[9]._vptr_Tile + 4) = *state;
      *(uint *)&nextTile[9].field_0xc = uVar13;
    }
    else {
      if (nextTile[9]._direction == Tile::currentUpdateTime) {
        return;
      }
      *(State *)&nextTile[9]._vptr_Tile = *state;
      nextTile[9]._direction = uVar13;
    }
    local_38 = (TileWire *)nextTile;
    (*pp_Var2[8])(nextTile,1,0);
    ppVar11 = traversedWires.
              super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_48.first = local_38;
    if (traversedWires.
        super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        traversedWires.
        super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_48.second = direction;
      std::vector<std::pair<TileWire*,Direction>,std::allocator<std::pair<TileWire*,Direction>>>::
      _M_realloc_insert<std::pair<TileWire*,Direction>>
                ((vector<std::pair<TileWire*,Direction>,std::allocator<std::pair<TileWire*,Direction>>>
                  *)&traversedWires,
                 (iterator)
                 traversedWires.
                 super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_48);
    }
    else {
      (traversedWires.
       super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->first = local_38;
      *(ulong *)&ppVar11->second = CONCAT44(local_48._12_4_,direction);
      traversedWires.
      super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           traversedWires.
           super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    ppVar6 = wireNodes.c.
             super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_48.first = local_38;
    if (wireNodes.c.
        super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        wireNodes.c.
        super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      local_48.second = direction;
      std::deque<std::pair<TileWire*,Direction>,std::allocator<std::pair<TileWire*,Direction>>>::
      _M_push_back_aux<std::pair<TileWire*,Direction>>
                ((deque<std::pair<TileWire*,Direction>,std::allocator<std::pair<TileWire*,Direction>>>
                  *)&wireNodes,&local_48);
    }
    else {
      (wireNodes.c.
       super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_38;
      *(ulong *)&ppVar6->second = CONCAT44(local_48._12_4_,direction);
      wireNodes.c.
      super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur =
           wireNodes.c.
           super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      local_48.second = direction;
    }
    pBVar12 = Tile::getBoardPtr(&this->super_Tile);
    if ((pBVar12->wireUpdates)._M_h._M_element_count == 0) {
      return;
    }
    if ((local_38->_type == CROSSOVER) &&
       (local_38->_updateTimestamp1 != local_38->_updateTimestamp2)) {
      return;
    }
    pBVar12 = Tile::getBoardPtr(&this->super_Tile);
    std::
    _Hashtable<TileWire_*,_TileWire_*,_std::allocator<TileWire_*>,_std::__detail::_Identity,_std::equal_to<TileWire_*>,_std::hash<TileWire_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase(&(pBVar12->wireUpdates)._M_h,&local_38);
    return;
  }
  local_48.first = (TileWire *)nextTile;
  if ((__s1 == "8TileGate") || ((*__s1 != '*' && (iVar7 = strcmp(__s1,"8TileGate"), iVar7 == 0)))) {
    DVar9 = Tile::getDirection(nextTile);
    uVar13 = DVar9 + 5;
    if (-1 < (int)(DVar9 + SOUTH)) {
      uVar13 = DVar9 + SOUTH;
    }
    SVar8 = DISCONNECTED;
    if ((DVar9 - (uVar13 & 0xfffffffc)) + SOUTH == direction) {
      nextTile = &(local_48.first)->super_Tile;
      SVar8 = TileGate::getNextState((TileGate *)local_48.first);
    }
    if (SVar8 != DISCONNECTED) {
      if (Board::enableExtraLogicStates == true) {
        _checkForInvalidState((TileWire *)nextTile,SVar8,state,stage);
        return;
      }
      if (SVar8 != HIGH) {
        return;
      }
      if (*state != LOW) {
        return;
      }
      *state = HIGH;
      ppVar5 = traversedWires.
               super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar11 = traversedWires.
                     super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppVar11 != ppVar5;
          ppVar11 = ppVar11 + 1) {
        pTVar3 = ppVar11->first;
        if ((pTVar3->_type == CROSSOVER) && ((ppVar11->second & 0x80000001) == EAST)) {
          pTVar3->_state2 = HIGH;
        }
        else {
          pTVar3->_state1 = HIGH;
        }
      }
      return;
    }
    if (Board::endpointGates.super__Vector_base<TileGate_*,_std::allocator<TileGate_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        Board::endpointGates.super__Vector_base<TileGate_*,_std::allocator<TileGate_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<TileGate*,std::allocator<TileGate*>>::_M_realloc_insert<TileGate*const&>
                ((vector<TileGate*,std::allocator<TileGate*>> *)&Board::endpointGates,
                 (iterator)
                 Board::endpointGates.super__Vector_base<TileGate_*,_std::allocator<TileGate_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(TileGate **)&local_48);
      return;
    }
    *Board::endpointGates.super__Vector_base<TileGate_*,_std::allocator<TileGate_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (TileGate *)local_48.first;
    pvVar10 = (vector<TileLED_*,_std::allocator<TileLED_*>_> *)&Board::endpointGates;
  }
  else {
    if ((__s1 != "7TileLED") && ((*__s1 == '*' || (iVar7 = strcmp(__s1,"7TileLED"), iVar7 != 0)))) {
      if ((__s1 != "10TileSwitch") &&
         (((*__s1 == '*' || (iVar7 = strcmp(__s1,"10TileSwitch"), iVar7 != 0)) &&
          (__s1 != "10TileButton")))) {
        if (*__s1 == '*') {
          return;
        }
        iVar7 = strcmp(__s1,"10TileButton");
        if (iVar7 != 0) {
          return;
        }
      }
      bVar4 = Board::enableExtraLogicStates;
      SVar8 = (*pp_Var2[2])();
      if (bVar4 == true) {
        _checkForInvalidState((TileWire *)nextTile,SVar8,state,stage);
        return;
      }
      if (SVar8 != HIGH) {
        return;
      }
      if (*state != LOW) {
        return;
      }
      *state = HIGH;
      ppVar5 = traversedWires.
               super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar11 = traversedWires.
                     super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppVar11 != ppVar5;
          ppVar11 = ppVar11 + 1) {
        pTVar3 = ppVar11->first;
        if ((pTVar3->_type == CROSSOVER) && ((ppVar11->second & 0x80000001) == EAST)) {
          pTVar3->_state2 = HIGH;
        }
        else {
          pTVar3->_state1 = HIGH;
        }
      }
      return;
    }
    pvVar10 = &Board::endpointLEDs;
    if (Board::endpointLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        Board::endpointLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<TileLED*,std::allocator<TileLED*>>::_M_realloc_insert<TileLED*>
                ((vector<TileLED*,std::allocator<TileLED*>> *)&Board::endpointLEDs,
                 (iterator)
                 Board::endpointLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(TileLED **)&local_48);
      return;
    }
    *Board::endpointLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (TileLED *)nextTile;
  }
  pppTVar1 = &(((vector<TileGate_*,_std::allocator<TileGate_*>_> *)pvVar10)->
              super__Vector_base<TileGate_*,_std::allocator<TileGate_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  *pppTVar1 = *pppTVar1 + 1;
  return;
}

Assistant:

void TileWire::_addNextTile(Tile* nextTile, Direction direction, State& state, FollowWireStage& stage) const {
    if (typeid(*nextTile) == typeid(TileWire)) {    // Check if nextTile is a wire (most common case).
        TileWire* nextWire = static_cast<TileWire*>(nextTile);
        if (CONNECTION_INFO[nextWire->_direction][nextWire->_type][direction][(direction + 2) % 4]) {    // Check if we have a connection back to the source.
            bool wireUpdated = false;
            if (nextWire->_type == CROSSOVER && direction % 2 == 1) {    // Update state of the wire and timestamp if this wire has not been traversed yet.
                if (nextWire->_updateTimestamp2 != Tile::currentUpdateTime) {
                    nextWire->_state2 = state;
                    nextWire->_updateTimestamp2 = Tile::currentUpdateTime;
                    wireUpdated = true;
                }
            } else if (nextWire->_updateTimestamp1 != Tile::currentUpdateTime) {
                nextWire->_state1 = state;
                nextWire->_updateTimestamp1 = Tile::currentUpdateTime;
                wireUpdated = true;
            }
            
            if (wireUpdated) {    // If wire updated in last step, give it a cosmetic update and add it to traversal structures.
                nextWire->addUpdate(true);
                traversedWires.push_back(pair<TileWire*, Direction>(nextWire, direction));
                wireNodes.push(pair<TileWire*, Direction>(nextWire, direction));
                if (!getBoardPtr()->wireUpdates.empty() && (nextWire->_type != CROSSOVER || nextWire->_updateTimestamp1 == nextWire->_updateTimestamp2)) {    // Attempt to remove update if scheduled and wire has been fully updated.
                    getBoardPtr()->wireUpdates.erase(nextWire);
                }
            }
        }
    } else if (typeid(*nextTile) == typeid(TileGate)) {    // Else check if it is a gate.
        TileGate* nextGate = static_cast<TileGate*>(nextTile);
        State gateNextState = (nextGate->getDirection() + 2) % 4 == direction ? nextGate->getNextState() : DISCONNECTED;    // If the gate outputs into previous wire, there may be a state conflict.
        if (gateNextState != DISCONNECTED) {
            if (Board::enableExtraLogicStates) {
                _checkForInvalidState(gateNextState, state, stage);
            } else if (gateNextState == HIGH && state == LOW) {    // If currently LOW and gate outputs HIGH in the next state, conflict found.
                state = HIGH;
                _fixTraversedWires(state);
            }
        } else {    // This gate is an endpoint, no need to check for conflict.
            Board::endpointGates.push_back(nextGate);
        }
    } else if (typeid(*nextTile) == typeid(TileLED)) {    // Else check if it is an LED.
        Board::endpointLEDs.push_back(static_cast<TileLED*>(nextTile));
    } else if (typeid(*nextTile) == typeid(TileSwitch) || typeid(*nextTile) == typeid(TileButton)) {    // Else check if switch/button.
        if (Board::enableExtraLogicStates) {
            _checkForInvalidState(nextTile->getState(), state, stage);
        } else if (nextTile->getState() == HIGH && state == LOW) {    // If currently LOW and switch/button outputs HIGH, conflict found.
            state = HIGH;
            _fixTraversedWires(state);
        }
    }
}